

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Semaphore.cpp
# Opt level: O3

void __thiscall
myvk::SemaphoreStageGroup::SemaphoreStageGroup
          (SemaphoreStageGroup *this,
          initializer_list<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>
          *stage_semaphores)

{
  allocator_type local_29;
  vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>
  local_28;
  
  (this->m_stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_semaphores).super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_semaphores).super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_semaphores).super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>
  ::vector(&local_28,*stage_semaphores,&local_29);
  Initialize(this,&local_28);
  std::
  vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>
  ::~vector(&local_28);
  return;
}

Assistant:

SemaphoreStageGroup::SemaphoreStageGroup(
    const std::initializer_list<std::pair<Ptr<Semaphore>, VkPipelineStageFlags>> &stage_semaphores) {
	Initialize(stage_semaphores);
}